

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
         *this)

{
  FloatFormat *pFVar1;
  TestLog *pTVar2;
  double *pdVar3;
  Precision PVar4;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar5;
  ShaderExecutor *pSVar6;
  Variable<tcu::Vector<float,_2>_> *pVVar7;
  pointer pcVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  _Rb_tree_node_base *p_Var13;
  IVal *pIVar14;
  long *plVar15;
  _Base_ptr ival;
  size_t sVar16;
  long lVar17;
  long lVar18;
  TestLog TVar19;
  undefined1 auVar20 [8];
  TestStatus *pTVar21;
  IVal in2;
  IVal reference1;
  IVal in3;
  FuncSet funcs;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_> outputs;
  IVal in0;
  void *outputArr [2];
  Environment env;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa98;
  pointer pVVar22;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
  *pBVar23;
  undefined1 local_560 [8];
  size_type local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_550;
  IVal local_540;
  TestLog *local_510;
  string local_508;
  undefined1 local_4e8 [8];
  undefined8 uStack_4e0;
  TestLog TStack_4d8;
  _Rb_tree_node_base *local_4d0;
  _Base_ptr local_4c8;
  double dStack_4c0;
  size_t local_4b8;
  ulong local_4b0;
  long local_4a8;
  TestStatus *local_4a0;
  FloatFormat local_498;
  FloatFormat *local_470;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_> local_468;
  undefined1 local_438 [8];
  double dStack_430;
  TestLog TStack_428;
  uint uStack_420;
  undefined4 uStack_41c;
  _Base_ptr local_418;
  double dStack_410;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_408;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  pointer local_2b8;
  pointer local_2b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2a8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  IVal local_1a8 [2];
  ios_base local_138 [264];
  
  this_00 = this->m_samplings;
  pFVar1 = &(this->m_caseCtx).floatFormat;
  PVar4 = (this->m_caseCtx).precision;
  sVar16 = (this->m_caseCtx).numRandoms;
  local_4a0 = __return_storage_ptr__;
  iVar11 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar1,(FloatFormat *)(ulong)PVar4,(Precision)sVar16,(ulong)(iVar11 + 0xdeadbeef),
             in_stack_fffffffffffffa98);
  pVVar22 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  sVar16 = (long)local_278.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_278.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>::Outputs
            (&local_468,sVar16);
  local_498.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_498.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_498.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_498.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_498.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_498.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_498.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_498.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_498._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_510 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = local_468.out0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_2b0 = local_468.out1.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_438 = (undefined1  [8])local_510;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81((ostringstream *)&dStack_430,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uStack_4e0 = (double)((ulong)uStack_4e0._4_4_ << 0x20);
  TStack_4d8.m_log = (qpTestLog *)0x0;
  dStack_4c0 = 0.0;
  pSVar5 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_4d0 = (_Rb_tree_node_base *)&uStack_4e0;
  local_4c8 = (_Rb_tree_node_base *)&uStack_4e0;
  local_4b8 = sVar16;
  (*pSVar5->_vptr_Statement[4])(pSVar5,local_4e8);
  if (local_4d0 != (_Rb_tree_node_base *)&uStack_4e0) {
    p_Var13 = local_4d0;
    do {
      (**(code **)(**(long **)(p_Var13 + 1) + 0x30))(*(long **)(p_Var13 + 1),local_1a8);
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != (_Rb_tree_node_base *)&uStack_4e0);
  }
  sVar16 = local_4b8;
  if (dStack_4c0 != 0.0) {
    local_438 = (undefined1  [8])local_510;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_430,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_430,(char *)local_540.m_data[0]._0_8_,
               (long)local_540.m_data[0].m_lo);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((double *)local_540.m_data[0]._0_8_ != &local_540.m_data[0].m_hi) {
      operator_delete((void *)local_540.m_data[0]._0_8_,(long)local_540.m_data[0].m_hi + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_4e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pSVar6 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar6->_vptr_ShaderExecutor[2])(pSVar6,sVar16 & 0xffffffff,&local_218,&local_2b8,0);
  local_438 = (undefined1  [8])((ulong)local_438 & 0xffffffffffffff00);
  dStack_430 = INFINITY;
  TStack_428.m_log = (qpTestLog *)0xfff0000000000000;
  uStack_420 = uStack_420 & 0xffffff00;
  local_418 = (_Base_ptr)0x7ff0000000000000;
  dStack_410 = -INFINITY;
  local_1a8[0].m_data[0]._0_8_ = local_1a8[0].m_data[0]._0_8_ & 0xffffffffffffff00;
  local_1a8[0].m_data[0].m_lo = INFINITY;
  local_1a8[0].m_data[0].m_hi = -INFINITY;
  local_1a8[0].m_data[1]._0_8_ = local_1a8[0].m_data[1]._0_8_ & 0xffffffffffffff00;
  local_1a8[0].m_data[1].m_lo = INFINITY;
  local_1a8[0].m_data[1].m_hi = -INFINITY;
  local_4e8 = (undefined1  [8])((ulong)local_4e8 & 0xffffffffffffff00);
  uStack_4e0 = INFINITY;
  TStack_4d8.m_log = (qpTestLog *)0xfff0000000000000;
  local_4d0 = (_Rb_tree_node_base *)((ulong)local_4d0 & 0xffffffffffffff00);
  local_4c8 = (_Base_ptr)0x7ff0000000000000;
  dStack_4c0 = -INFINITY;
  local_540.m_data[0]._0_8_ = local_540.m_data[0]._0_8_ & 0xffffffffffffff00;
  local_540.m_data[0].m_lo = INFINITY;
  local_540.m_data[0].m_hi = -INFINITY;
  local_540.m_data[1].m_hasNaN = false;
  local_540.m_data[1].m_lo = INFINITY;
  local_540.m_data[1].m_hi = -INFINITY;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2a8,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_438);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2a8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2a8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_560);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2a8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_508);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2a8,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_4e8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2a8,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             &local_540);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar22) {
LAB_008b54a9:
    local_438 = (undefined1  [8])local_510;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"All ",4);
    pTVar21 = local_4a0;
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
    std::ios_base::~ios_base(local_3c0);
    local_438 = (undefined1  [8])&TStack_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Pass","");
    pTVar21->m_code = QP_TEST_RESULT_PASS;
    (pTVar21->m_description)._M_dataplus._M_p = (pointer)&(pTVar21->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar21->m_description,local_438,
               (long)(qpTestLog **)local_438 + (long)dStack_430);
    TVar19.m_log = TStack_428.m_log;
    auVar20 = local_438;
    if (local_438 == (undefined1  [8])&TStack_428) goto LAB_008b568f;
  }
  else {
    lVar17 = sVar16 + (sVar16 == 0);
    lVar18 = 0;
    local_4b0 = 0;
    local_470 = pFVar1;
    do {
      pFVar1 = local_470;
      local_1a8[0].m_data[0]._0_8_ = local_1a8[0].m_data[0]._0_8_ & 0xffffffffffffff00;
      local_1a8[0].m_data[0].m_lo = INFINITY;
      local_1a8[0].m_data[0].m_hi = -INFINITY;
      local_1a8[0].m_data[1]._0_8_ = local_1a8[0].m_data[1]._0_8_ & 0xffffffffffffff00;
      local_1a8[0].m_data[1].m_lo = INFINITY;
      local_1a8[0].m_data[1].m_hi = -INFINITY;
      local_4e8 = (undefined1  [8])((ulong)local_4e8 & 0xffffffffffffff00);
      uStack_4e0 = INFINITY;
      TStack_4d8.m_log = (qpTestLog *)0xfff0000000000000;
      local_4d0 = (_Rb_tree_node_base *)((ulong)local_4d0 & 0xffffffffffffff00);
      local_4c8 = (_Base_ptr)0x7ff0000000000000;
      dStack_4c0 = -INFINITY;
      local_560._0_4_ =
           *(float *)((long)(local_278.in0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18);
      local_560._4_4_ =
           *(float *)((long)(local_278.in0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18 + 4);
      local_4a8 = lVar17;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                (&local_540,local_470,(Vector<float,_2> *)local_560);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,pFVar1,&local_540);
      pIVar14 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2a8,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar14->m_data[1].m_lo = (double)local_418;
      pIVar14->m_data[1].m_hi = dStack_410;
      pIVar14->m_data[0].m_hi = (double)TStack_428.m_log;
      *(ulong *)(pIVar14->m_data + 1) = CONCAT44(uStack_41c,uStack_420);
      pIVar14->m_data[0].m_hasNaN = local_438;
      pIVar14->m_data[0].m_lo = dStack_430;
      local_560._0_4_ =
           *(float *)((long)(local_278.in1.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18);
      local_560._4_4_ =
           *(float *)((long)(local_278.in1.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18 + 4);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                (&local_540,pFVar1,(Vector<float,_2> *)local_560);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,pFVar1,&local_540);
      pIVar14 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2a8,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar14->m_data[1].m_lo = (double)local_418;
      pIVar14->m_data[1].m_hi = dStack_410;
      pIVar14->m_data[0].m_hi = (double)TStack_428.m_log;
      *(ulong *)(pIVar14->m_data + 1) = CONCAT44(uStack_41c,uStack_420);
      pIVar14->m_data[0].m_hasNaN = local_438;
      pIVar14->m_data[0].m_lo = dStack_430;
      pBVar23 = this;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2a8,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2a8,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      ival = (_Base_ptr)pFVar1->m_maxValue;
      local_438 = *(undefined1 (*) [8])pFVar1;
      dStack_430 = *(double *)&pFVar1->m_fractionBits;
      TStack_428.m_log = *(qpTestLog **)&pFVar1->m_hasInf;
      uStack_420 = *(uint *)&pFVar1->m_exactPrecision;
      uStack_41c = *(undefined4 *)&pFVar1->field_0x1c;
      dStack_410 = (double)CONCAT44(dStack_410._4_4_,(this->m_caseCtx).precision);
      local_400 = 0;
      pSVar5 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_418 = ival;
      local_408 = &local_2a8;
      (*pSVar5->_vptr_Statement[3])(pSVar5,(MessageBuilder *)local_438);
      pIVar14 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2a8,
                           (this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,&local_498,pIVar14);
      local_4d0 = (_Rb_tree_node_base *)CONCAT44(uStack_41c,uStack_420);
      local_4c8 = local_418;
      dStack_4c0 = dStack_410;
      TStack_4d8.m_log = TStack_428.m_log;
      local_4e8 = local_438;
      uStack_4e0 = dStack_430;
      bVar9 = contains<tcu::Vector<float,2>>
                        ((IVal *)local_4e8,
                         (Vector<float,_2> *)
                         ((long)(local_468.out1.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18));
      local_438 = (undefined1  [8])&TStack_428;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 1 is outside acceptable range","");
      bVar9 = tcu::ResultCollector::check(&local_1f8,bVar9,(string *)local_438);
      this = pBVar23;
      if (local_438 != (undefined1  [8])&TStack_428) {
        operator_delete((void *)local_438,(ulong)((long)&(TStack_428.m_log)->flags + 1));
        this = pBVar23;
      }
      pIVar14 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2a8,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,&local_498,pIVar14);
      local_1a8[0].m_data[1]._0_8_ = CONCAT44(uStack_41c,uStack_420);
      local_1a8[0].m_data[1].m_lo = (double)local_418;
      local_1a8[0].m_data[1].m_hi = dStack_410;
      local_1a8[0].m_data[0].m_hi = (double)TStack_428.m_log;
      local_1a8[0].m_data[0]._0_8_ = local_438;
      local_1a8[0].m_data[0].m_lo = dStack_430;
      bVar10 = contains<tcu::Vector<float,2>>
                         (local_1a8,
                          (Vector<float,_2> *)
                          ((long)(local_468.out0.
                                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18));
      local_438 = (undefined1  [8])&TStack_428;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 0 is outside acceptable range","");
      bVar10 = tcu::ResultCollector::check(&local_1f8,bVar10,(string *)local_438);
      if (local_438 != (undefined1  [8])&TStack_428) {
        operator_delete((void *)local_438,(ulong)((long)&(TStack_428.m_log)->flags + 1));
      }
      if (!bVar9 || !bVar10) {
        uVar12 = (int)local_4b0 + 1;
        local_4b0 = (ulong)uVar12;
        pdVar3 = &local_540.m_data[0].m_hi;
        if ((int)uVar12 < 0x65) {
          local_438 = (undefined1  [8])local_510;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\t",1);
          pVVar7 = (this->m_variables).in0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                   m_ptr;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_540.m_data[0]._0_8_ = pdVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_540,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)local_540.m_data[0]._0_8_,
                     (long)local_540.m_data[0].m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_560,(shaderexecutor *)&local_498,
                     (FloatFormat *)
                     ((long)(local_278.in0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18),
                     (Vector<float,_2> *)ival);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)CONCAT44(local_560._4_4_,local_560._0_4_),
                     local_558);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_560._4_4_,local_560._0_4_) != &local_550) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_560._4_4_,local_560._0_4_),
                            local_550._M_allocated_capacity + 1);
          }
          if ((double *)local_540.m_data[0]._0_8_ != pdVar3) {
            operator_delete((void *)local_540.m_data[0]._0_8_,(long)local_540.m_data[0].m_hi + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\t",1);
          pVVar7 = (this->m_variables).in1.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                   m_ptr;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_540.m_data[0]._0_8_ = pdVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_540,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)local_540.m_data[0]._0_8_,
                     (long)local_540.m_data[0].m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_560,(shaderexecutor *)&local_498,
                     (FloatFormat *)
                     ((long)(local_278.in1.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18),
                     (Vector<float,_2> *)ival);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)CONCAT44(local_560._4_4_,local_560._0_4_),
                     local_558);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_560._4_4_,local_560._0_4_) != &local_550) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_560._4_4_,local_560._0_4_),
                            local_550._M_allocated_capacity + 1);
          }
          if ((double *)local_540.m_data[0]._0_8_ != pdVar3) {
            operator_delete((void *)local_540.m_data[0]._0_8_,(long)local_540.m_data[0].m_hi + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\t",1);
          pVVar7 = (this->m_variables).out0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                   m_ptr;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_540.m_data[0]._0_8_ = pdVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_540,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)local_540.m_data[0]._0_8_,
                     (long)local_540.m_data[0].m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_560,(shaderexecutor *)&local_498,
                     (FloatFormat *)
                     ((long)(local_468.out0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18),
                     (Vector<float,_2> *)ival);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)CONCAT44(local_560._4_4_,local_560._0_4_),
                     local_558);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,2>>
                    (&local_508,(shaderexecutor *)&local_498,(FloatFormat *)local_1a8,(IVal *)ival);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,local_508._M_dataplus._M_p,local_508._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._M_dataplus._M_p != &local_508.field_2) {
            operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_560._4_4_,local_560._0_4_) != &local_550) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_560._4_4_,local_560._0_4_),
                            local_550._M_allocated_capacity + 1);
          }
          if ((double *)local_540.m_data[0]._0_8_ != pdVar3) {
            operator_delete((void *)local_540.m_data[0]._0_8_,(long)local_540.m_data[0].m_hi + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\t",1);
          pVVar7 = (this->m_variables).out1.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                   m_ptr;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_540.m_data[0]._0_8_ = pdVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_540,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)local_540.m_data[0]._0_8_,
                     (long)local_540.m_data[0].m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_560,(shaderexecutor *)&local_498,
                     (FloatFormat *)
                     ((long)(local_468.out1.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18),
                     (Vector<float,_2> *)ival);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)CONCAT44(local_560._4_4_,local_560._0_4_),
                     local_558);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,2>>
                    (&local_508,(shaderexecutor *)&local_498,(FloatFormat *)local_4e8,(IVal *)ival);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,local_508._M_dataplus._M_p,local_508._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._M_dataplus._M_p != &local_508.field_2) {
            operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_560._4_4_,local_560._0_4_) != &local_550) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_560._4_4_,local_560._0_4_),
                            local_550._M_allocated_capacity + 1);
          }
          if ((double *)local_540.m_data[0]._0_8_ != pdVar3) {
            operator_delete((void *)local_540.m_data[0]._0_8_,(long)local_540.m_data[0].m_hi + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
          std::ios_base::~ios_base(local_3c0);
        }
      }
      lVar18 = lVar18 + 8;
      lVar17 = local_4a8 + -1;
    } while (lVar17 != 0);
    iVar11 = (int)local_4b0;
    if (iVar11 < 0x65) {
      if (iVar11 == 0) goto LAB_008b54a9;
    }
    else {
      local_438 = (undefined1  [8])local_510;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&dStack_430,iVar11 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
      std::ios_base::~ios_base(local_3c0);
    }
    local_438 = (undefined1  [8])local_510;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
    std::ostream::operator<<((ostringstream *)&dStack_430,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
    std::ios_base::~ios_base(local_3c0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
    std::ostream::operator<<(local_438,iVar11);
    pTVar21 = local_4a0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    local_438 = (undefined1  [8])&TStack_428;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438," test failed. Check log for the details","");
    TVar19.m_log = (qpTestLog *)0xf;
    if (local_4e8 != (undefined1  [8])&TStack_4d8) {
      TVar19.m_log = TStack_4d8.m_log;
    }
    if (TVar19.m_log < (qpTestLog *)((long)dStack_430 + (long)uStack_4e0)) {
      TVar19.m_log = (qpTestLog *)0xf;
      if (local_438 != (undefined1  [8])&TStack_428) {
        TVar19.m_log = TStack_428.m_log;
      }
      if (TVar19.m_log < (qpTestLog *)((long)dStack_430 + (long)uStack_4e0)) goto LAB_008b5497;
      plVar15 = (long *)std::__cxx11::string::replace
                                  ((ulong)local_438,0,(char *)0x0,(ulong)local_4e8);
    }
    else {
LAB_008b5497:
      plVar15 = (long *)std::__cxx11::string::_M_append(local_4e8,(ulong)local_438);
    }
    local_1a8[0].m_data[0]._0_8_ = &local_1a8[0].m_data[0].m_hi;
    pTVar2 = (TestLog *)(plVar15 + 2);
    if ((TestLog *)*plVar15 == pTVar2) {
      local_1a8[0].m_data[0].m_hi = (double)pTVar2->m_log;
      local_1a8[0].m_data[1]._0_8_ = plVar15[3];
    }
    else {
      local_1a8[0].m_data[0].m_hi = (double)pTVar2->m_log;
      local_1a8[0].m_data[0]._0_8_ = (double *)*plVar15;
    }
    local_1a8[0].m_data[0].m_lo = (double)plVar15[1];
    *plVar15 = (long)pTVar2;
    plVar15[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    pTVar21->m_code = QP_TEST_RESULT_FAIL;
    (pTVar21->m_description)._M_dataplus._M_p = (pointer)&(pTVar21->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar21->m_description,local_1a8[0].m_data[0]._0_8_,
               local_1a8[0].m_data[0]._0_8_ + (long)local_1a8[0].m_data[0].m_lo);
    if ((double *)local_1a8[0].m_data[0]._0_8_ != &local_1a8[0].m_data[0].m_hi) {
      operator_delete((void *)local_1a8[0].m_data[0]._0_8_,
                      (ulong)((long)(deUint32 *)local_1a8[0].m_data[0].m_hi + 1));
    }
    if (local_438 != (undefined1  [8])&TStack_428) {
      operator_delete((void *)local_438,(ulong)((long)&(TStack_428.m_log)->flags + 1));
    }
    TVar19.m_log = TStack_4d8.m_log;
    auVar20 = local_4e8;
    if (local_4e8 == (undefined1  [8])&TStack_4d8) goto LAB_008b568f;
  }
  operator_delete((void *)auVar20,(ulong)((long)&(TVar19.m_log)->flags + 1));
LAB_008b568f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2a8);
  if (local_468.out1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_468.out0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar21;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}